

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::parseModule
          (Result<wasm::Ok> *__return_storage_ptr__,WATParser *this,Module *wasm,string_view in,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *filename)

{
  string_view buffer;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  Module *local_98;
  char *pcStack_90;
  undefined1 local_88 [8];
  Lexer lexer;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *filename_local;
  Module *wasm_local;
  string_view in_local;
  
  lexer.buffer._M_str = in._M_str;
  pcStack_90 = (char *)in._M_len;
  local_98 = wasm;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&local_c0,
           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)lexer.buffer._M_str);
  buffer._M_str = pcStack_90;
  buffer._M_len = (size_t)local_98;
  Lexer::Lexer((Lexer *)local_88,buffer,&local_c0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_c0);
  anon_unknown_12::doParseModule(__return_storage_ptr__,(Module *)this,(Lexer *)local_88,false);
  Lexer::~Lexer((Lexer *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Result<> parseModule(Module& wasm,
                     std::string_view in,
                     std::optional<std::string> filename) {
  Lexer lexer(in, filename);
  return doParseModule(wasm, lexer, false);
}